

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnCompareExpr(BinaryReaderIR *this,Opcode opcode)

{
  Result RVar1;
  Opcode local_2c;
  _Head_base<0UL,_wabt::Expr_*,_false> _Stack_28;
  Opcode opcode_local;
  Expr *local_20;
  
  local_2c.enum_ = opcode.enum_;
  MakeUnique<wabt::OpcodeExpr<(wabt::ExprType)13>,wabt::Opcode&>((wabt *)&local_20,&local_2c);
  _Stack_28._M_head_impl = local_20;
  local_20 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                          &stack0xffffffffffffffd8);
  if (_Stack_28._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)_Stack_28._M_head_impl + 8))();
  }
  if (local_20 != (Expr *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnCompareExpr(Opcode opcode) {
  return AppendExpr(MakeUnique<CompareExpr>(opcode));
}